

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void exp2reg(FuncState *fs,expdesc *e,int reg)

{
  int iVar1;
  int in_EDX;
  FuncState *in_RSI;
  FuncState *in_RDI;
  int fj;
  FuncState *unaff_retaddr;
  int p_t;
  int p_f;
  int final;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int A;
  int dtarget;
  int in_stack_ffffffffffffffe4;
  int reg_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  discharge2reg(unaff_retaddr,(expdesc *)in_RDI,(int)((ulong)in_RSI >> 0x20));
  if (*(int *)&in_RSI->f == 10) {
    luaK_concat(in_RSI,(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  }
  if (*(int *)&in_RSI->prev == *(int *)((long)&in_RSI->prev + 4)) goto LAB_00116432;
  reg_00 = -1;
  dtarget = -1;
  iVar1 = need_value((FuncState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  if (iVar1 == 0) {
    iVar1 = need_value((FuncState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0)
    ;
    if (iVar1 != 0) goto LAB_0011637e;
  }
  else {
LAB_0011637e:
    if (*(int *)&in_RSI->f == 10) {
      iVar1 = -1;
    }
    else {
      iVar1 = luaK_jump((FuncState *)CONCAT44(reg_00,dtarget));
    }
    A = iVar1;
    reg_00 = code_label((FuncState *)CONCAT44(reg_00,dtarget),iVar1,iVar1,0);
    dtarget = code_label((FuncState *)CONCAT44(reg_00,dtarget),A,iVar1,0);
    luaK_patchtohere((FuncState *)CONCAT44(reg_00,dtarget),A);
  }
  iVar1 = luaK_getlabel(in_RDI);
  patchlistaux(in_RSI,in_EDX,iVar1,reg_00,dtarget);
  patchlistaux(in_RSI,in_EDX,iVar1,reg_00,dtarget);
LAB_00116432:
  *(undefined4 *)&in_RSI->prev = 0xffffffff;
  *(undefined4 *)((long)&in_RSI->prev + 4) = 0xffffffff;
  *(int *)&in_RSI->h = in_EDX;
  *(undefined4 *)&in_RSI->f = 0xc;
  return;
}

Assistant:

static void exp2reg(FuncState*fs,expdesc*e,int reg){
discharge2reg(fs,e,reg);
if(e->k==VJMP)
luaK_concat(fs,&e->t,e->u.s.info);
if(hasjumps(e)){
int final;
int p_f=(-1);
int p_t=(-1);
if(need_value(fs,e->t)||need_value(fs,e->f)){
int fj=(e->k==VJMP)?(-1):luaK_jump(fs);
p_f=code_label(fs,reg,0,1);
p_t=code_label(fs,reg,1,0);
luaK_patchtohere(fs,fj);
}
final=luaK_getlabel(fs);
patchlistaux(fs,e->f,final,reg,p_f);
patchlistaux(fs,e->t,final,reg,p_t);
}
e->f=e->t=(-1);
e->u.s.info=reg;
e->k=VNONRELOC;
}